

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_yplus_dist(REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_DBL rho,REF_DBL t,REF_DBL y,
                   REF_DBL u,REF_DBL *yplus_dist)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL u_tau;
  REF_DBL nu_mach_re;
  REF_DBL mu;
  REF_DBL *yplus_dist_local;
  REF_DBL u_local;
  REF_DBL y_local;
  REF_DBL t_local;
  REF_DBL rho_local;
  REF_DBL reference_t_k_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  
  *yplus_dist = -1.0;
  mu = (REF_DBL)yplus_dist;
  yplus_dist_local = (REF_DBL *)u;
  u_local = y;
  y_local = t;
  t_local = rho;
  rho_local = reference_t_k;
  reference_t_k_local = re;
  re_local = mach;
  uVar1 = viscosity_law(t,reference_t_k,&nu_mach_re);
  if (uVar1 == 0) {
    u_tau = ((nu_mach_re / t_local) * re_local) / reference_t_k_local;
    mach_local._4_4_ =
         ref_phys_u_tau(u_local,(REF_DBL)yplus_dist_local,u_tau,
                        (REF_DBL *)&ref_private_macro_code_rss_1);
    if (mach_local._4_4_ == 0) {
      *(double *)mu = u_tau / _ref_private_macro_code_rss_1;
      mach_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2b4,
             "ref_phys_yplus_dist",(ulong)mach_local._4_4_,"u_tau");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2b2,
           "ref_phys_yplus_dist",(ulong)uVar1,"sutherlands");
    mach_local._4_4_ = uVar1;
  }
  return mach_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_dist(REF_DBL mach, REF_DBL re,
                                       REF_DBL reference_t_k, REF_DBL rho,
                                       REF_DBL t, REF_DBL y, REF_DBL u,
                                       REF_DBL *yplus_dist) {
  REF_DBL mu, nu_mach_re, u_tau;
  *yplus_dist = -1.0;
  RSS(viscosity_law(t, reference_t_k, &mu), "sutherlands");
  nu_mach_re = mu / rho * mach / re;
  RSS(ref_phys_u_tau(y, u, nu_mach_re, &u_tau), "u_tau");
  *yplus_dist = nu_mach_re / u_tau;
  return REF_SUCCESS;
}